

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool InputTextFilterCharacter
               (uint *p_char,ImGuiInputTextFlags flags,ImGuiInputTextCallback callback,
               void *user_data)

{
  int iVar1;
  uint uVar2;
  ImGuiInputTextCallbackData local_40;
  
  uVar2 = *p_char;
  if (uVar2 < 0x20) {
    if ((((byte)((uint)flags >> 0x14) & uVar2 == 10) == 0) &&
       (((uint)flags >> 10 & 1) == 0 || uVar2 != 9)) {
      return false;
    }
  }
  else if (uVar2 == 0x7f) {
    return false;
  }
  if (uVar2 < 0x10000 && 0x18ff < uVar2 - 0xe000) {
    if ((flags & 0x2000fU) != 0) {
      if (uVar2 - 0x3a < 0xfffffff6 && (flags & 1U) != 0) {
        if (0x2f < (ushort)uVar2) {
          return false;
        }
        if ((0xec0000000000U >> ((ulong)(uVar2 & 0xffff) & 0x3f) & 1) == 0) {
          return false;
        }
      }
      if ((((((uint)flags >> 0x11 & 1) != 0) && ((uVar2 & 0xffdf) != 0x45)) &&
          (uVar2 - 0x3a < 0xfffffff3)) && (uVar2 - 0x2c < 0xfffffffe)) {
        return false;
      }
      if ((5 < uVar2 - 0x41 && (flags & 2U) != 0) && (5 < uVar2 - 0x61 && 9 < uVar2 - 0x30)) {
        return false;
      }
      if ((uVar2 - 0x61 < 0x1a & (byte)flags >> 2) == 1) {
        uVar2 = uVar2 - 0x20;
        *p_char = uVar2;
      }
      if ((flags & 8U) != 0) {
        if (uVar2 == 9) {
          return false;
        }
        if (uVar2 == 0x20) {
          return false;
        }
        if (uVar2 == 0x3000) {
          return false;
        }
      }
    }
    if (((uint)flags >> 9 & 1) == 0) {
      return true;
    }
    local_40.Buf = (char *)0x0;
    local_40.BufTextLen = 0;
    local_40.BufSize = 0;
    local_40.BufDirty = false;
    local_40._41_3_ = 0;
    local_40.CursorPos = 0;
    local_40.SelectionStart = 0;
    local_40.SelectionEnd = 0;
    local_40.EventFlag = 0x200;
    local_40._18_6_ = 0;
    local_40.EventChar = (ushort)uVar2;
    local_40.Flags = flags;
    local_40.UserData = user_data;
    iVar1 = (*callback)(&local_40);
    if (iVar1 == 0) {
      *p_char = (uint)local_40.EventChar;
      if (local_40.EventChar != 0) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool InputTextFilterCharacter(unsigned int* p_char, ImGuiInputTextFlags flags, ImGuiInputTextCallback callback, void* user_data)
{
    unsigned int c = *p_char;

    // Filter non-printable (NB: isprint is unreliable! see #2467)
    if (c < 0x20)
    {
        bool pass = false;
        pass |= (c == '\n' && (flags & ImGuiInputTextFlags_Multiline));
        pass |= (c == '\t' && (flags & ImGuiInputTextFlags_AllowTabInput));
        if (!pass)
            return false;
    }

    // We ignore Ascii representation of delete (emitted from Backspace on OSX, see #2578, #2817)
    if (c == 127)
        return false;

    // Filter private Unicode range. GLFW on OSX seems to send private characters for special keys like arrow keys (FIXME)
    if (c >= 0xE000 && c <= 0xF8FF)
        return false;

    // Filter Unicode ranges we are not handling in this build.
    if (c > IM_UNICODE_CODEPOINT_MAX)
        return false;

    // Generic named filters
    if (flags & (ImGuiInputTextFlags_CharsDecimal | ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsUppercase | ImGuiInputTextFlags_CharsNoBlank | ImGuiInputTextFlags_CharsScientific))
    {
        if (flags & ImGuiInputTextFlags_CharsDecimal)
            if (!(c >= '0' && c <= '9') && (c != '.') && (c != '-') && (c != '+') && (c != '*') && (c != '/'))
                return false;

        if (flags & ImGuiInputTextFlags_CharsScientific)
            if (!(c >= '0' && c <= '9') && (c != '.') && (c != '-') && (c != '+') && (c != '*') && (c != '/') && (c != 'e') && (c != 'E'))
                return false;

        if (flags & ImGuiInputTextFlags_CharsHexadecimal)
            if (!(c >= '0' && c <= '9') && !(c >= 'a' && c <= 'f') && !(c >= 'A' && c <= 'F'))
                return false;

        if (flags & ImGuiInputTextFlags_CharsUppercase)
            if (c >= 'a' && c <= 'z')
                *p_char = (c += (unsigned int)('A'-'a'));

        if (flags & ImGuiInputTextFlags_CharsNoBlank)
            if (ImCharIsBlankW(c))
                return false;
    }

    // Custom callback filter
    if (flags & ImGuiInputTextFlags_CallbackCharFilter)
    {
        ImGuiInputTextCallbackData callback_data;
        memset(&callback_data, 0, sizeof(ImGuiInputTextCallbackData));
        callback_data.EventFlag = ImGuiInputTextFlags_CallbackCharFilter;
        callback_data.EventChar = (ImWchar)c;
        callback_data.Flags = flags;
        callback_data.UserData = user_data;
        if (callback(&callback_data) != 0)
            return false;
        *p_char = callback_data.EventChar;
        if (!callback_data.EventChar)
            return false;
    }

    return true;
}